

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spec.h
# Opt level: O3

void __thiscall bandit::reporter::spec::test_run_error(spec *this,string *desc,test_run_error *err)

{
  size_t *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char cVar3;
  ostream *poVar4;
  char *__s;
  size_t sVar5;
  _List_node_base *p_Var6;
  stringstream ss;
  string local_1c0;
  stringstream local_1a0 [16];
  long local_190 [14];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  cVar3 = (char)(ostream *)local_190;
  std::ios::widen((char)*(undefined8 *)(local_190[0] + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"Failed to run \"",0xf);
  progress_base::current_context_name_abi_cxx11_(&local_1c0,(progress_base *)this);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_190,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\": error \"",10);
  __s = (char *)(**(code **)(*(long *)err + 0x10))(err);
  if (__s == (char *)0x0) {
    std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
  }
  else {
    sVar5 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,__s,sVar5);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\"",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  paVar2 = &local_1c0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != paVar2) {
    operator_delete(local_1c0._M_dataplus._M_p,
                    CONCAT71(local_1c0.field_2._M_allocated_capacity._1_7_,
                             local_1c0.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::stringbuf::str();
  p_Var6 = (_List_node_base *)operator_new(0x30);
  p_Var6[1]._M_next = p_Var6 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p == paVar2) {
    p_Var6[2]._M_next =
         (_List_node_base *)
         CONCAT71(local_1c0.field_2._M_allocated_capacity._1_7_,local_1c0.field_2._M_local_buf[0]);
    p_Var6[2]._M_prev = (_List_node_base *)local_1c0.field_2._8_8_;
  }
  else {
    p_Var6[1]._M_next = (_List_node_base *)local_1c0._M_dataplus._M_p;
    p_Var6[2]._M_next =
         (_List_node_base *)
         CONCAT71(local_1c0.field_2._M_allocated_capacity._1_7_,local_1c0.field_2._M_local_buf[0]);
  }
  p_Var6[1]._M_prev = (_List_node_base *)local_1c0._M_string_length;
  local_1c0._M_string_length = 0;
  local_1c0.field_2._M_local_buf[0] = '\0';
  local_1c0._M_dataplus._M_p = (pointer)paVar2;
  std::__detail::_List_node_base::_M_hook(p_Var6);
  psVar1 = &(this->super_colored_base).super_progress_base.test_run_errors_.
            super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != paVar2) {
    operator_delete(local_1c0._M_dataplus._M_p,
                    CONCAT71(local_1c0.field_2._M_allocated_capacity._1_7_,
                             local_1c0.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return;
}

Assistant:

void test_run_error(const std::string& desc, const detail::test_run_error& err) override {
        progress_base::test_run_error(desc, err);

        std::stringstream ss;
        ss << std::endl;
        ss << "Failed to run \"" << current_context_name() << "\": error \"" << err.what() << "\"" << std::endl;

        test_run_errors_.push_back(ss.str());
      }